

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

void xml_test_done(pcut_item_t *test,int outcome,char *error_message,char *teardown_error_message,
                  char *extra_output)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = test->name;
  if (outcome == 0) {
    pcVar2 = "pass";
  }
  else {
    failed_tests_in_suite = failed_tests_in_suite + 1;
    pcVar2 = "error";
    if (outcome == 1) {
      pcVar2 = "fail";
    }
  }
  printf("\t\t<testcase name=\"%s\" status=\"%s\">\n",pcVar1,pcVar2);
  print_by_lines(error_message,"error-message");
  print_by_lines(teardown_error_message,"error-message");
  print_by_lines(extra_output,"standard-output");
  printf("\t\t</testcase><!-- %s -->\n",pcVar1);
  return;
}

Assistant:

static void xml_test_done(pcut_item_t *test, int outcome,
		const char *error_message, const char *teardown_error_message,
		const char *extra_output) {
	const char *test_name = test->name;
	const char *status_str = NULL;

	if (outcome != PCUT_OUTCOME_PASS) {
		failed_tests_in_suite++;
	}

	switch (outcome) {
	case PCUT_OUTCOME_PASS:
		status_str = "pass";
		break;
	case PCUT_OUTCOME_FAIL:
		status_str = "fail";
		break;
	default:
		status_str = "error";
		break;
	}

	printf("\t\t<testcase name=\"%s\" status=\"%s\">\n", test_name,
		status_str);

	print_by_lines(error_message, "error-message");
	print_by_lines(teardown_error_message, "error-message");

	print_by_lines(extra_output, "standard-output");

	printf("\t\t</testcase><!-- %s -->\n", test_name);
}